

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O0

bool __thiscall
cppnet::TimerContainer::AddTimer
          (TimerContainer *this,weak_ptr<cppnet::TimerSlot> *t,uint32_t time,bool always)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  shared_ptr<cppnet::TimerSlot> local_70 [2];
  weak_ptr<cppnet::TimerSlot> local_50;
  undefined4 local_3c;
  undefined1 local_38 [8];
  shared_ptr<cppnet::TimerSlot> ptr;
  bool always_local;
  uint32_t time_local;
  weak_ptr<cppnet::TimerSlot> *t_local;
  TimerContainer *this_local;
  
  if (time < this->_timer_max) {
    ptr.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ =
         always;
    ptr.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         time;
    std::weak_ptr<cppnet::TimerSlot>::lock((weak_ptr<cppnet::TimerSlot> *)local_38);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
    if (bVar1) {
      if ((ptr.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
           _4_4_ < this->_time_unit) &&
         (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->_sub_timer), bVar1
         )) {
        peVar3 = std::
                 __shared_ptr_access<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->_sub_timer);
        std::weak_ptr<cppnet::TimerSlot>::weak_ptr(&local_50,t);
        iVar2 = (**(peVar3->super_Timer)._vptr_Timer)
                          (peVar3,&local_50,
                           (ulong)ptr.
                                  super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi._4_4_,
                           (ulong)(ptr.
                                   super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi._3_1_ & 1));
        this_local._7_1_ = (bool)((byte)iVar2 & 1);
        std::weak_ptr<cppnet::TimerSlot>::~weak_ptr(&local_50);
      }
      else {
        peVar4 = std::
                 __shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_38);
        bVar1 = TimerSlot::IsInTimer(peVar4);
        if (bVar1) {
          this_local._7_1_ = false;
        }
        else {
          peVar4 = std::
                   __shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_38);
          TimerSlot::SetInterval
                    (peVar4,ptr.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi._4_4_);
          peVar4 = std::
                   __shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_38);
          TimerSlot::SetInTimer(peVar4);
          if ((ptr.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._3_1_ & 1) != 0) {
            peVar4 = std::
                     __shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_38);
            TimerSlot::SetAlways(peVar4);
          }
          std::shared_ptr<cppnet::TimerSlot>::shared_ptr
                    (local_70,(shared_ptr<cppnet::TimerSlot> *)local_38);
          this_local._7_1_ =
               InnerAddTimer(this,local_70,
                             ptr.super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._4_4_);
          std::shared_ptr<cppnet::TimerSlot>::~shared_ptr(local_70);
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
    local_3c = 1;
    std::shared_ptr<cppnet::TimerSlot>::~shared_ptr((shared_ptr<cppnet::TimerSlot> *)local_38);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TimerContainer::AddTimer(std::weak_ptr<TimerSlot> t, uint32_t time, bool always) {
    if (time >= _timer_max) {
        return false;
    }

    auto ptr = t.lock();
    if (!ptr) {
        return false;
    }

    if (time < _time_unit && _sub_timer) {
        return _sub_timer->AddTimer(t, time, always);
    }

    // set current timer unit interval
    if (!ptr->IsInTimer()) {
        ptr->SetInterval(time);
        ptr->SetInTimer();
        if (always) {
            ptr->SetAlways();
        }

    } else {
        return false;
    }

    return InnerAddTimer(ptr, time);
}